

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_negate_unchecked(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  int m_local;
  secp256k1_fe *a_local;
  secp256k1_fe *r_local;
  
  r->n[0] = (long)(m + 1) * 0x1ffffdfffff85e - a->n[0];
  r->n[1] = (long)(m + 1) * 0x1ffffffffffffe - a->n[1];
  r->n[2] = (long)(m + 1) * 0x1ffffffffffffe - a->n[2];
  r->n[3] = (long)(m + 1) * 0x1ffffffffffffe - a->n[3];
  r->n[4] = (long)(m + 1) * 0x1fffffffffffe - a->n[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_impl_negate_unchecked(secp256k1_fe *r, const secp256k1_fe *a, int m) {
    /* For all legal values of m (0..31), the following properties hold: */
    VERIFY_CHECK(0xFFFFEFFFFFC2FULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m);
    VERIFY_CHECK(0xFFFFFFFFFFFFFULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m);
    VERIFY_CHECK(0x0FFFFFFFFFFFFULL * 2 * (m + 1) >= 0x0FFFFFFFFFFFFULL * 2 * m);

    /* Due to the properties above, the left hand in the subtractions below is never less than
     * the right hand. */
    r->n[0] = 0xFFFFEFFFFFC2FULL * 2 * (m + 1) - a->n[0];
    r->n[1] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[1];
    r->n[2] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[2];
    r->n[3] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[3];
    r->n[4] = 0x0FFFFFFFFFFFFULL * 2 * (m + 1) - a->n[4];
}